

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawShader::FBarShader::FBarShader(FBarShader *this,bool vertical,bool reverse)

{
  BYTE BVar1;
  WORD WVar2;
  long lVar3;
  undefined7 in_register_00000031;
  WORD WVar4;
  bool bVar5;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_00863c08;
  bVar5 = (int)CONCAT71(in_register_00000031,vertical) != 0;
  WVar4 = 2;
  WVar2 = 0x100;
  if (bVar5) {
    WVar2 = 2;
  }
  (this->super_FTexture).Width = WVar2;
  if (bVar5) {
    WVar4 = 0x100;
  }
  (this->super_FTexture).Height = WVar4;
  FTexture::CalcBitSize(&this->super_FTexture);
  if (vertical) {
    if (reverse) {
      BVar1 = 0xff;
      lVar3 = -0x100;
      do {
        this->Pixels[lVar3 + 0x100] = BVar1;
        *(BYTE *)((long)&this->DummySpan[0].TopOffset + lVar3) = BVar1;
        BVar1 = BVar1 + 0xff;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
    }
    else {
      lVar3 = 0;
      do {
        this->Pixels[lVar3] = (BYTE)lVar3;
        this->Pixels[lVar3 + 0x100] = (BYTE)lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x100);
    }
  }
  else if (reverse) {
    lVar3 = 0;
    do {
      this->Pixels[lVar3 * 2] = (BYTE)lVar3;
      this->Pixels[lVar3 * 2 + 1] = (BYTE)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
  }
  else {
    BVar1 = 0xff;
    lVar3 = 0;
    do {
      this->Pixels[lVar3 * 2] = BVar1;
      this->Pixels[lVar3 * 2 + 1] = BVar1;
      lVar3 = lVar3 + 1;
      BVar1 = BVar1 + 0xff;
    } while (lVar3 != 0x100);
  }
  this->DummySpan[0].TopOffset = 0;
  this->DummySpan[0].Length = WVar4;
  this->DummySpan[1].TopOffset = 0;
  this->DummySpan[1].Length = 0;
  return;
}

Assistant:

FBarShader(bool vertical, bool reverse)
			{
				int i;

				Width = vertical ? 2 : 256;
				Height = vertical ? 256 : 2;
				CalcBitSize();

				// Fill the column/row with shading values.
				// Vertical shaders have have minimum alpha at the top
				// and maximum alpha at the bottom, unless flipped by
				// setting reverse to true. Horizontal shaders are just
				// the opposite.
				if (vertical)
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = i;
							Pixels[256+i] = i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = 255 - i;
							Pixels[256+i] = 255 -i;
						}
					}
				}
				else
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = 255 - i;
							Pixels[i*2+1] = 255 - i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = i;
							Pixels[i*2+1] = i;
						}
					}
				}
				DummySpan[0].TopOffset = 0;
				DummySpan[0].Length = vertical ? 256 : 2;
				DummySpan[1].TopOffset = 0;
				DummySpan[1].Length = 0;
			}